

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.h
# Opt level: O0

failure_formatter_t * __thiscall bandit::detail::controller_t::get_formatter(controller_t *this)

{
  pointer ptr;
  type piVar1;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  controller_t *local_10;
  controller_t *this_local;
  
  local_10 = this;
  ptr = std::
        unique_ptr<bandit::failure_formatter::interface,_std::default_delete<bandit::failure_formatter::interface>_>
        ::get(&this->formatter);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"formatter",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_68,"bandit::detail::controller_t::set_formatter()",&local_69);
  throw_if_nullptr(ptr,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  piVar1 = std::
           unique_ptr<bandit::failure_formatter::interface,_std::default_delete<bandit::failure_formatter::interface>_>
           ::operator*(&this->formatter);
  return piVar1;
}

Assistant:

failure_formatter_t& get_formatter() {
        throw_if_nullptr(formatter.get(), "formatter", "bandit::detail::controller_t::set_formatter()");
        return *formatter;
      }